

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

void lj_lex_cleanup(lua_State *L,LexState *ls)

{
  int iVar1;
  undefined8 uVar2;
  ulong uVar3;
  long lVar4;
  long in_RSI;
  long in_RDI;
  global_State *g;
  
  uVar3 = (ulong)*(uint *)(in_RDI + 8);
  uVar2 = *(undefined8 *)(in_RSI + 0x88);
  lVar4 = (ulong)*(uint *)(in_RSI + 0x90) << 3;
  *(int *)(uVar3 + 0x20) = *(int *)(uVar3 + 0x20) - (int)lVar4;
  (**(code **)(uVar3 + 0x10))(*(undefined8 *)(uVar3 + 0x18),uVar2,lVar4,0);
  uVar2 = *(undefined8 *)(in_RSI + 0x78);
  lVar4 = (ulong)*(uint *)(in_RSI + 0x80) << 4;
  *(int *)(uVar3 + 0x20) = *(int *)(uVar3 + 0x20) - (int)lVar4;
  (**(code **)(uVar3 + 0x10))(*(undefined8 *)(uVar3 + 0x18),uVar2,lVar4,0);
  uVar2 = *(undefined8 *)(in_RSI + 0x38);
  iVar1 = *(int *)(in_RSI + 0x44);
  *(int *)(uVar3 + 0x20) = *(int *)(uVar3 + 0x20) - iVar1;
  (**(code **)(uVar3 + 0x10))(*(undefined8 *)(uVar3 + 0x18),uVar2,iVar1,0);
  return;
}

Assistant:

void lj_lex_cleanup(lua_State *L, LexState *ls)
{
  global_State *g = G(L);
  lj_mem_freevec(g, ls->bcstack, ls->sizebcstack, BCInsLine);
  lj_mem_freevec(g, ls->vstack, ls->sizevstack, VarInfo);
  lj_str_freebuf(g, &ls->sb);
}